

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_asm_x86.h
# Opt level: O0

Reg asm_fuseload(ASMState *as,IRRef ref,RegSet allow)

{
  int32_t iVar1;
  uint uVar2;
  Reg RVar3;
  int iVar4;
  IRIns *ir_00;
  RegSet local_38;
  RegSet xallow;
  RegSet avail_1;
  RegSet avail;
  IRIns *ir;
  RegSet allow_local;
  IRRef ref_local;
  ASMState *as_local;
  
  ir_00 = as->ir + ref;
  if (((ir_00->field_1).r & 0x80) == 0) {
    if (allow != 0) {
      as->weakset = (1 << ((ir_00->field_1).r & 0x1f) ^ 0xffffffffU) & as->weakset;
      return (uint)(ir_00->field_1).r;
    }
  }
  else {
    if ((ir_00->field_1).o == '\x1c') {
      uVar2 = as->freeset & (as->modset ^ 0xffffffff) & 0xffff0000;
      if ((uVar2 & uVar2 - 1) == 0) {
        RVar3 = asm_fuseloadk64(as,ir_00);
        return RVar3;
      }
    }
    else if ((ref == 0x8000) || ((ir_00->field_1).o == '\x1d')) {
      uVar2 = as->freeset & (as->modset ^ 0xffffffff) & 0xbfef;
      if ((uVar2 & uVar2 - 1) == 0) {
        if (ref == 0x8000) {
          (as->mrm).ofs = ((int)as->J + -0x160) - ((int)as->J + 0xca8);
          (as->mrm).base = '\x0e';
          (as->mrm).idx = 0x80;
          return 0x20;
        }
        RVar3 = asm_fuseloadk64(as,ir_00);
        return RVar3;
      }
    }
    else if (as->fuseref < ref) {
      local_38 = allow;
      if ((allow & 0xbfef) == 0) {
        local_38 = 0xbfef;
      }
      if ((ir_00->field_1).o == 'G') {
        if (((((ir_00->field_0).op2 & 9) == 0) && (iVar4 = noconflict(as,ref,IR_RETF,2), iVar4 != 0)
            ) && (9 < ((ir_00->field_1).t.irt & 0x1f) - 3)) {
          RVar3 = ra_alloc1(as,0x8000,local_38);
          (as->mrm).base = (uint8_t)RVar3;
          (as->mrm).ofs = ((ir_00->field_0).op1 - 2) * 8;
          (as->mrm).idx = 0x80;
          return 0x20;
        }
      }
      else if ((ir_00->field_1).o == 'E') {
        if ((((((ir_00->field_1).t.irt & 0x1f) == 0x13) || (((ir_00->field_1).t.irt & 0x1f) == 0x14)
             ) || (((ir_00->field_1).t.irt & 0x1f) - 3 < 10)) &&
           (iVar4 = noconflict(as,ref,IR_FSTORE,2), iVar4 != 0)) {
          asm_fusefref(as,ir_00,local_38);
          return 0x20;
        }
      }
      else if ((((ir_00->field_1).o == 'B') || ((ir_00->field_1).o == 'C')) ||
              ((ir_00->field_1).o == 'D')) {
        iVar4 = noconflict(as,ref,(ir_00->field_1).o + IR_EQ,((ir_00->field_1).o != 'D') + 2);
        if ((iVar4 != 0) && (9 < ((ir_00->field_1).t.irt & 0x1f) - 3)) {
          asm_fuseahuref(as,(uint)(ir_00->field_0).op1,local_38);
          return 0x20;
        }
      }
      else if ((ir_00->field_1).o == 'F') {
        if ((3 < ((ir_00->field_1).t.irt & 0x1f) - 0xf) &&
           (iVar4 = noconflict(as,ref,IR_XSTORE,2), iVar4 != 0)) {
          asm_fusexref(as,(uint)(ir_00->field_0).op1,local_38);
          return 0x20;
        }
      }
      else if ((((ir_00->field_1).o == 'H') &&
               (*(char *)((long)as->ir + (ulong)(ir_00->field_0).op1 * 8 + 5) == '8')) &&
              (9 < ((ir_00->field_1).t.irt & 0x1f) - 3)) {
        asm_fuseahuref(as,(uint)(ir_00->field_0).op1,local_38);
        (as->mrm).ofs = (uint)(ir_00->field_0).op2 * 8 + (as->mrm).ofs;
        return 0x20;
      }
    }
    if (((ir_00->field_1).o == 'E') && ((ir_00->field_0).op1 == 0x7fff)) {
      asm_fusefref(as,ir_00,0);
      return 0x20;
    }
    if ((((as->freeset & allow) != 0) || (ref < 0x8001)) ||
       ((allow != 0 && (((ir_00->field_1).s == '\0' && (as->sectref <= ref)))))) {
      RVar3 = ra_allocref(as,ref,allow);
      return RVar3;
    }
  }
  (as->mrm).base = '\x04';
  iVar1 = ra_spill(as,ir_00);
  (as->mrm).ofs = iVar1;
  (as->mrm).idx = 0x80;
  return 0x20;
}

Assistant:

static Reg asm_fuseload(ASMState *as, IRRef ref, RegSet allow)
{
  IRIns *ir = IR(ref);
  if (ra_hasreg(ir->r)) {
    if (allow != RSET_EMPTY) {  /* Fast path. */
      ra_noweak(as, ir->r);
      return ir->r;
    }
  fusespill:
    /* Force a spill if only memory operands are allowed (asm_x87load). */
    as->mrm.base = RID_ESP;
    as->mrm.ofs = ra_spill(as, ir);
    as->mrm.idx = RID_NONE;
    return RID_MRM;
  }
  if (ir->o == IR_KNUM) {
    RegSet avail = as->freeset & ~as->modset & RSET_FPR;
    lj_assertA(allow != RSET_EMPTY, "no register allowed");
    if (!(avail & (avail-1)))  /* Fuse if less than two regs available. */
      return asm_fuseloadk64(as, ir);
  } else if (ref == REF_BASE || ir->o == IR_KINT64) {
    RegSet avail = as->freeset & ~as->modset & RSET_GPR;
    lj_assertA(allow != RSET_EMPTY, "no register allowed");
    if (!(avail & (avail-1))) {  /* Fuse if less than two regs available. */
      if (ref == REF_BASE) {
#if LJ_GC64
	as->mrm.ofs = (int32_t)dispofs(as, &J2G(as->J)->jit_base);
	as->mrm.base = RID_DISPATCH;
#else
	as->mrm.ofs = ptr2addr(&J2G(as->J)->jit_base);
	as->mrm.base = RID_NONE;
#endif
	as->mrm.idx = RID_NONE;
	return RID_MRM;
      } else {
	return asm_fuseloadk64(as, ir);
      }
    }
  } else if (mayfuse(as, ref)) {
    RegSet xallow = (allow & RSET_GPR) ? allow : RSET_GPR;
    if (ir->o == IR_SLOAD) {
      if (!(ir->op2 & (IRSLOAD_PARENT|IRSLOAD_CONVERT)) &&
	  noconflict(as, ref, IR_RETF, 2) &&
	  !(LJ_GC64 && irt_isaddr(ir->t))) {
	as->mrm.base = (uint8_t)ra_alloc1(as, REF_BASE, xallow);
	as->mrm.ofs = 8*((int32_t)ir->op1-1-LJ_FR2) +
		      (!LJ_FR2 && (ir->op2 & IRSLOAD_FRAME) ? 4 : 0);
	as->mrm.idx = RID_NONE;
	return RID_MRM;
      }
    } else if (ir->o == IR_FLOAD) {
      /* Generic fusion is only ok for 32 bit operand (but see asm_comp). */
      if ((irt_isint(ir->t) || irt_isu32(ir->t) || irt_isaddr(ir->t)) &&
	  noconflict(as, ref, IR_FSTORE, 2)) {
	asm_fusefref(as, ir, xallow);
	return RID_MRM;
      }
    } else if (ir->o == IR_ALOAD || ir->o == IR_HLOAD || ir->o == IR_ULOAD) {
      if (noconflict(as, ref, ir->o + IRDELTA_L2S, 2+(ir->o != IR_ULOAD)) &&
	  !(LJ_GC64 && irt_isaddr(ir->t))) {
	asm_fuseahuref(as, ir->op1, xallow);
	return RID_MRM;
      }
    } else if (ir->o == IR_XLOAD) {
      /* Generic fusion is not ok for 8/16 bit operands (but see asm_comp).
      ** Fusing unaligned memory operands is ok on x86 (except for SIMD types).
      */
      if ((!irt_typerange(ir->t, IRT_I8, IRT_U16)) &&
	  noconflict(as, ref, IR_XSTORE, 2)) {
	asm_fusexref(as, ir->op1, xallow);
	return RID_MRM;
      }
    } else if (ir->o == IR_VLOAD && IR(ir->op1)->o == IR_AREF &&
	       !(LJ_GC64 && irt_isaddr(ir->t))) {
      asm_fuseahuref(as, ir->op1, xallow);
      as->mrm.ofs += 8 * ir->op2;
      return RID_MRM;
    }
  }
  if (ir->o == IR_FLOAD && ir->op1 == REF_NIL) {
    asm_fusefref(as, ir, RSET_EMPTY);
    return RID_MRM;
  }
  if (!(as->freeset & allow) && !emit_canremat(ref) &&
      (allow == RSET_EMPTY || ra_hasspill(ir->s) || iscrossref(as, ref)))
    goto fusespill;
  return ra_allocref(as, ref, allow);
}